

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgExoticQuadrature.hpp
# Opt level: O2

double TasGrid::lagrange_eval(size_t idx,vector<double,_std::allocator<double>_> *roots,double x)

{
  pointer pdVar1;
  size_t i;
  size_t sVar2;
  ulong uVar3;
  double dVar4;
  
  pdVar1 = (roots->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  dVar4 = 1.0;
  for (sVar2 = 0; idx != sVar2; sVar2 = sVar2 + 1) {
    dVar4 = dVar4 * ((x - pdVar1[sVar2]) / (pdVar1[idx] - pdVar1[sVar2]));
  }
  for (uVar3 = idx + 1;
      uVar3 < (ulong)((long)(roots->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)pdVar1 >> 3);
      uVar3 = uVar3 + 1) {
    dVar4 = dVar4 * ((x - pdVar1[uVar3]) / (pdVar1[idx] - pdVar1[uVar3]));
  }
  return dVar4;
}

Assistant:

inline double lagrange_eval(size_t idx, const std::vector<double> &roots, double x) {
    double eval_value = 1.0;
    for (size_t i=0; i<idx; i++) {
        eval_value *= (x - roots[i]) / (roots[idx] - roots[i]);
    }
    for (size_t i=idx+1; i<roots.size(); i++) {
        eval_value *= (x - roots[i]) / (roots[idx] - roots[i]);
    }
    return eval_value;
}